

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktau.hpp
# Opt level: O0

double wdm::impl::ktau_stat_adjust
                 (vector<double,_std::allocator<double>_> *x,
                 vector<double,_std::allocator<double>_> *y,
                 vector<double,_std::allocator<double>_> *weights)

{
  size_type sVar1;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar2;
  double dVar3;
  __type _Var4;
  double dVar5;
  double dVar6;
  __type _Var7;
  __type _Var8;
  double in_XMM1_Qa;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  vector<double,_std::allocator<double>_> *in_stack_00000020;
  double v;
  double v_2;
  double v_1;
  double v_0;
  double r;
  double s3;
  double s2;
  double s;
  double v_y;
  double trip_y;
  double pair_y;
  double v_x;
  double trip_x;
  double pair_x;
  int __y;
  allocator_type *in_stack_fffffffffffffed8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee0;
  size_type in_stack_fffffffffffffee8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffef0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffef8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff00;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff28;
  utils local_b8 [24];
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  undefined8 local_68;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  
  utils::check_sizes(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  utils::sort_all(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  local_20 = utils::count_tied_pairs(in_RDI,in_stack_ffffffffffffff08);
  local_28 = utils::count_tied_triplets(in_RDX,in_RSI);
  local_30 = utils::count_ties_v(in_RDI,in_stack_ffffffffffffff08);
  utils::sort_all(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  local_38 = utils::count_tied_pairs(in_RDI,in_stack_ffffffffffffff08);
  local_40 = utils::count_tied_triplets(in_RDX,in_RSI);
  local_48 = utils::count_ties_v(in_RDI,in_stack_ffffffffffffff08);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
  if (sVar1 == 0) {
    std::vector<double,_std::allocator<double>_>::size(in_RDI);
    local_68 = 0x3ff0000000000000;
    std::allocator<double>::allocator((allocator<double> *)0x110b12);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               (value_type *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffffee0,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed8);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffee0);
    std::allocator<double>::~allocator((allocator<double> *)0x110b5f);
  }
  local_88 = utils::sum(in_stack_fffffffffffffee0);
  local_90 = utils::perm_sum(in_stack_ffffffffffffff28,(size_t)in_RDX);
  local_98 = utils::perm_sum(in_stack_ffffffffffffff28,(size_t)in_RDX);
  dVar5 = local_88;
  utils::pow(local_b8,local_88,in_XMM1_Qa);
  dVar2 = utils::sum(in_stack_fffffffffffffee0);
  dVar2 = dVar5 / dVar2;
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffee0);
  dVar3 = local_90 * 2.0 * local_88 * 2.0;
  __y = (int)((ulong)dVar5 >> 0x20);
  local_a0 = dVar2;
  _Var4 = std::pow<double,int>(dVar2,__y);
  dVar3 = dVar3 * _Var4;
  dVar5 = (local_20 * 2.0 * 2.0 * local_38) / (local_90 * 4.0);
  _Var4 = std::pow<double,int>(dVar2,__y);
  dVar6 = (local_28 * 6.0 * 6.0 * local_40) / (local_98 * 54.0);
  _Var7 = std::pow<double,int>(dVar2,__y);
  _Var8 = std::pow<double,int>(dVar2,__y);
  dVar5 = (-_Var8 * (local_30 - local_48) + dVar3) / 18.0 + dVar5 * _Var4 + dVar6 * _Var7;
  _Var4 = std::pow<double,int>(dVar2,__y);
  dVar5 = sqrt(((local_90 - local_20) * (local_90 - local_38)) / dVar5);
  return _Var4 * dVar5;
}

Assistant:

inline double ktau_stat_adjust(
    std::vector<double> x,
    std::vector<double> y,
    std::vector<double> weights)
{
    utils::check_sizes(x, y, weights);

    // 1.1 Sort x, y, and weights in x order; break ties in according to y.
    utils::sort_all(x, y, weights);

    // 1.2 Count pairs and triplets of tied x and simultaneous ties in x and y.
    double pair_x = utils::count_tied_pairs(x, weights);
    double trip_x = utils::count_tied_triplets(x, weights);
    double v_x = utils::count_ties_v(x, weights);

    // 2.1 Sort y and weights in y order; break ties according to x.
    utils::sort_all(y, x, weights);

    // 2.2 Count pairs and triplets of tied y.
    double pair_y = utils::count_tied_pairs(y, weights);
    double trip_y = utils::count_tied_triplets(y, weights);
    double v_y = utils::count_ties_v(y, weights);

    // 3. Calculate adjustment factor.
    if (weights.size() == 0)
        weights = std::vector<double>(x.size(), 1.0);
    double s = utils::sum(weights);
    double s2 = utils::perm_sum(weights, 2);
    double s3 = utils::perm_sum(weights, 3);
    double r = s / utils::sum(utils::pow(weights, 2));
    double v_0 = 2 * s2 * (2 * s) * std::pow(r, 3);
    double v_1 = 2 * pair_x * 2 * pair_y / (2 * 2 * s2) * std::pow(r, 2);
    double v_2 = 6 * trip_x * 6 * trip_y / (9 * 6 * s3) * std::pow(r, 3);
    double v = (v_0 - std::pow(r, 3) * (v_x - v_y)) / 18 + (v_1 + v_2);
    return std::pow(r, 2) * std::sqrt((s2 - pair_x) * (s2 - pair_y) / v);
}